

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

int cargo_fprintl_args(FILE *f,int argc,char **argv,int start,cargo_fprint_flags_t flags,
                      size_t max_width,size_t highlight_count,cargo_highlight_t *highlights)

{
  char *ptr;
  char *ret;
  size_t max_width_local;
  cargo_fprint_flags_t flags_local;
  int start_local;
  char **argv_local;
  int argc_local;
  FILE *f_local;
  
  ptr = cargo_get_fprintl_args(argc,argv,start,flags,max_width,highlight_count,highlights);
  if (ptr == (char *)0x0) {
    f_local._4_4_ = -1;
  }
  else {
    fprintf((FILE *)f,"%s\n",ptr);
    _cargo_free(ptr);
    f_local._4_4_ = 0;
  }
  return f_local._4_4_;
}

Assistant:

int cargo_fprintl_args(FILE *f, int argc, char **argv, int start,
                       cargo_fprint_flags_t flags,
                       size_t max_width, size_t highlight_count,
                       const cargo_highlight_t *highlights)
{
    char *ret;
    if (!(ret = cargo_get_fprintl_args(argc, argv, start, flags,
                                max_width, highlight_count, highlights)))
    {
        return -1;
    }

    fprintf(f, "%s\n", ret);
    _cargo_free(ret);
    return 0;
}